

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

bool __thiscall
cmStandardLevelResolver::CheckCompileFeaturesAvailable
          (cmStandardLevelResolver *this,string *targetName,string *feature,string *lang,
          string *error)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  ostream *poVar3;
  string *psVar4;
  string local_2a8;
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  ostringstream e;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableFeatures;
  cmValue features;
  string *error_local;
  string *lang_local;
  string *feature_local;
  string *targetName_local;
  cmStandardLevelResolver *this_local;
  
  bVar2 = CompileFeatureKnown(this,targetName,feature,lang,error);
  if (bVar2) {
    this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,lang);
    if (bVar2) {
      availableFeatures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CompileFeaturesAvailable(this,lang,error);
      bVar2 = cmValue::operator_cast_to_bool
                        ((cmValue *)
                         &availableFeatures.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58,
                   (cmValue)availableFeatures.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
        bVar2 = ::cm::
                contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_58,feature);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          poVar3 = std::operator<<((ostream *)local_1e8,"The compiler feature \"");
          poVar3 = std::operator<<(poVar3,(string *)feature);
          poVar3 = std::operator<<(poVar3,"\" is not known to ");
          poVar3 = std::operator<<(poVar3,(string *)lang);
          poVar3 = std::operator<<(poVar3," compiler\n\"");
          pcVar1 = this->Makefile;
          std::operator+(&local_228,"CMAKE_",lang);
          std::operator+(&local_208,&local_228,"_COMPILER_ID");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_208);
          poVar3 = std::operator<<(poVar3,(string *)psVar4);
          poVar3 = std::operator<<(poVar3,"\"\nversion ");
          pcVar1 = this->Makefile;
          std::operator+(&local_268,"CMAKE_",lang);
          std::operator+(&local_248,&local_268,"_COMPILER_VERSION");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_248);
          poVar3 = std::operator<<(poVar3,(string *)psVar4);
          std::operator<<(poVar3,".");
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_228);
          if (error == (string *)0x0) {
            pcVar1 = this->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2a8);
            std::__cxx11::string::~string((string *)&local_2a8);
          }
          else {
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)error,local_288);
            std::__cxx11::string::~string(local_288);
          }
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmStandardLevelResolver::CheckCompileFeaturesAvailable(
  const std::string& targetName, const std::string& feature, std::string& lang,
  std::string* error) const
{
  if (!this->CompileFeatureKnown(targetName, feature, lang, error)) {
    return false;
  }

  if (!this->Makefile->GetGlobalGenerator()->GetLanguageEnabled(lang)) {
    return true;
  }

  cmValue features = this->CompileFeaturesAvailable(lang, error);
  if (!features) {
    return false;
  }

  std::vector<std::string> availableFeatures = cmExpandedList(features);
  if (!cm::contains(availableFeatures, feature)) {
    std::ostringstream e;
    e << "The compiler feature \"" << feature << "\" is not known to " << lang
      << " compiler\n\""
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang +
                                           "_COMPILER_VERSION")
      << ".";
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return false;
  }

  return true;
}